

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

void __thiscall implementations::scheme::SchemeFrame::nextArgument(SchemeFrame *this)

{
  cell *value;
  bool bVar1;
  
  while (value = (this->arg_it)._M_current,
        value != (this->arguments).
                 super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = resolveArgument(this,value);
    if (!bVar1) {
      return;
    }
    (this->arg_it)._M_current = (this->arg_it)._M_current + 1;
  }
  bVar1 = dispatchCall(this);
  if (!bVar1) {
    return;
  }
  nextExpression(this);
  return;
}

Assistant:

void nextArgument() {
		if (arg_it == arguments.cend())
			dispatch();
		else if (resolveArgument(*arg_it)) {
			++arg_it;
			nextArgument();
		}
	}